

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

ssize_t __thiscall OPL3::write(OPL3 *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  Operator *(*extraout_RAX) [32];
  Operator *(*extraout_RAX_00) [32];
  Operator *(*extraout_RAX_01) [32];
  Operator *(*extraout_RAX_02) [32];
  Operator *(*extraout_RAX_03) [32];
  Operator *(*extraout_RAX_04) [32];
  Operator *(*extraout_RAX_05) [32];
  Operator *(*extraout_RAX_06) [32];
  Operator *(*extraout_RAX_07) [32];
  Operator *(*extraout_RAX_08) [32];
  Operator *(*extraout_RAX_09) [32];
  Operator *(*extraout_RAX_10) [32];
  int operatorOffset;
  int registerAddress;
  int data_local;
  int address_local;
  int array_local;
  OPL3 *this_local;
  Operator *(*papOVar3) [32];
  
  uVar2 = (uint)__buf;
  uVar1 = __fd << 8 | uVar2;
  papOVar3 = (Operator *(*) [32])(ulong)uVar1;
  if ((-1 < (int)uVar1) && ((int)uVar1 < 0x200)) {
    operatorOffset._0_1_ = (BYTE)__n;
    this->registers[(int)uVar1] = (BYTE)operatorOffset;
    uVar1 = uVar2 & 0xe0;
    papOVar3 = (Operator *(*) [32])(ulong)uVar1;
    if (((ulong)__buf & 0xe0) == 0) {
      if (__fd == 1) {
        if (uVar2 == 4) {
          update_2_CONNECTIONSEL6(this);
          papOVar3 = extraout_RAX;
        }
        else if (uVar2 == 5) {
          update_7_NEW1(this);
          papOVar3 = extraout_RAX_00;
        }
      }
      else if (uVar2 == 8) {
        update_1_NTS1_6(this);
        papOVar3 = extraout_RAX_01;
      }
    }
    else {
      papOVar3 = (Operator *(*) [32])(ulong)(uVar1 - 0xa0);
      if (uVar1 - 0xa0 == 0) {
        if (uVar2 == 0xbd) {
          if (__fd == 0) {
            update_DAM1_DVB1_RYT1_BD1_SD1_TOM1_TC1_HH1(this);
            papOVar3 = extraout_RAX_02;
          }
        }
        else if (((uVar2 & 0xf0) == 0xb0) && ((int)uVar2 < 0xb9)) {
          Channel::update_2_KON1_BLOCK3_FNUMH2(this->channels[__fd][(int)(uVar2 & 0xf)],this);
          papOVar3 = extraout_RAX_03;
        }
        else {
          papOVar3 = (Operator *(*) [32])(ulong)(uVar2 & 0xf0);
          if (((uVar2 & 0xf0) == 0xa0) && ((int)uVar2 < 0xa9)) {
            Channel::update_FNUML8(this->channels[__fd][(int)(uVar2 & 0xf)],this);
            papOVar3 = extraout_RAX_04;
          }
        }
      }
      else {
        papOVar3 = (Operator *(*) [32])(ulong)(uVar1 - 0xc0);
        if (uVar1 - 0xc0 == 0) {
          if ((int)uVar2 < 0xc9) {
            Channel::update_CHD1_CHC1_CHB1_CHA1_FB3_CNT1
                      (this->channels[__fd][(int)(uVar2 & 0xf)],this);
            papOVar3 = extraout_RAX_05;
          }
        }
        else {
          uVar1 = uVar2 & 0x1f;
          papOVar3 = this->operators + __fd;
          if ((*papOVar3)[(int)uVar1] != (Operator *)0x0) {
            uVar2 = uVar2 & 0xe0;
            if (uVar2 == 0x20) {
              Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(this->operators[__fd][(int)uVar1],this);
              papOVar3 = extraout_RAX_06;
            }
            else if (uVar2 == 0x40) {
              Operator::update_KSL2_TL6(this->operators[__fd][(int)uVar1],this);
              papOVar3 = extraout_RAX_07;
            }
            else if (uVar2 == 0x60) {
              Operator::update_AR4_DR4(this->operators[__fd][(int)uVar1],this);
              papOVar3 = extraout_RAX_08;
            }
            else if (uVar2 == 0x80) {
              Operator::update_SL4_RR4(this->operators[__fd][(int)uVar1],this);
              papOVar3 = extraout_RAX_09;
            }
            else {
              papOVar3 = (Operator *(*) [32])(ulong)(uVar2 - 0xe0);
              if (uVar2 - 0xe0 == 0) {
                Operator::update_5_WS3(this->operators[__fd][(int)uVar1],this);
                papOVar3 = extraout_RAX_10;
              }
            }
          }
        }
      }
    }
  }
  return (ssize_t)papOVar3;
}

Assistant:

void OPL3::write(int array, int address, int data) {
    // The OPL3 has two registers arrays, each with adresses ranging
    // from 0x00 to 0xF5.
    // This emulator uses one array, with the two original register arrays
    // starting at 0x00 and at 0x100.
    int registerAddress = (array<<8) | address;        
    // If the address is out of the OPL3 memory map, returns.
    if(registerAddress<0 || registerAddress>=0x200) return;

    registers[registerAddress] = data;
    switch(address&0xE0) {
        // The first 3 bits masking gives the type of the register by using its base address:
        // 0x00, 0x20, 0x40, 0x60, 0x80, 0xA0, 0xC0, 0xE0 
        // When it is needed, we further separate the register type inside each base address,
        // which is the case of 0x00 and 0xA0.
        
        // Through out this emulator we will use the same name convention to
        // reference a byte with several bit registers.
        // The name of each bit register will be followed by the number of bits
        // it occupies inside the byte. 
        // Numbers without accompanying names are unused bits.
        case 0x00:
            // Unique registers for the entire OPL3:                
           if(array==1) {
                if(address==0x04) 
                    update_2_CONNECTIONSEL6();
                else if(address==0x05) 
                    update_7_NEW1();
            }
            else if(address==0x08) update_1_NTS1_6();
            break;
            
        case 0xA0:
            // 0xBD is a control register for the entire OPL3:
            if(address==0xBD) {
                if(array==0) 
                    update_DAM1_DVB1_RYT1_BD1_SD1_TOM1_TC1_HH1();
                break;
            }
            // Registers for each channel are in A0-A8, B0-B8, C0-C8, in both register arrays.
            // 0xB0...0xB8 keeps kon,block,fnum(h) for each channel.
            if( (address&0xF0) == 0xB0 && address <= 0xB8) {
                // If the address is in the second register array, adds 9 to the channel number.
                // The channel number is given by the last four bits, like in A0,...,A8.
                channels[array][address&0x0F]->update_2_KON1_BLOCK3_FNUMH2(this);
                break;                    
            }
            // 0xA0...0xA8 keeps fnum(l) for each channel.
            if( (address&0xF0) == 0xA0 && address <= 0xA8)
                channels[array][address&0x0F]->update_FNUML8(this);
            break;                    
        // 0xC0...0xC8 keeps cha,chb,chc,chd,fb,cnt for each channel:
        case 0xC0:
            if(address <= 0xC8)
                channels[array][address&0x0F]->update_CHD1_CHC1_CHB1_CHA1_FB3_CNT1(this);
            break;
            
        // Registers for each of the 36 Operators:
        default:
            int operatorOffset = address&0x1F;
            if(operators[array][operatorOffset] == NULL) break;
            switch(address&0xE0) {
                // 0x20...0x35 keeps am,vib,egt,ksr,mult for each operator:                
                case 0x20:
                    operators[array][operatorOffset]->update_AM1_VIB1_EGT1_KSR1_MULT4(this);
                    break;
                // 0x40...0x55 keeps ksl,tl for each operator: 
                case 0x40:
                    operators[array][operatorOffset]->update_KSL2_TL6(this);
                    break;
                // 0x60...0x75 keeps ar,dr for each operator: 
                case 0x60:
                    operators[array][operatorOffset]->update_AR4_DR4(this);
                    break;
                // 0x80...0x95 keeps sl,rr for each operator:
                case 0x80:
                    operators[array][operatorOffset]->update_SL4_RR4(this);
                    break;
                // 0xE0...0xF5 keeps ws for each operator:
                case 0xE0:     
                    operators[array][operatorOffset]->update_5_WS3(this);
            }
    }
}